

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
 __thiscall anon_unknown.dwarf_1f0a16::RawTRDescriptor::Clone(RawTRDescriptor *this)

{
  pointer pPVar1;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  *in_RSI;
  __uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
  in_RDI;
  long in_FS_OFFSET;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  *in_stack_ffffffffffffff98;
  unique_ptr<(anonymous_namespace)::RawTRDescriptor,_std::default_delete<(anonymous_namespace)::RawTRDescriptor>_>
  *in_stack_ffffffffffffffa0;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *in_stack_ffffffffffffffa8;
  unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
  *this_00;
  unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
  local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::at(in_stack_ffffffffffffffa8,(size_type)in_stack_ffffffffffffffa0);
  pPVar1 = std::
           unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
           ::operator->(in_stack_ffffffffffffff98);
  (*pPVar1->_vptr_PubkeyProvider[0xb])();
  std::
  make_unique<(anonymous_namespace)::RawTRDescriptor,std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
            (in_RSI);
  this_00 = &local_10;
  std::
  unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>
  ::
  unique_ptr<(anonymous_namespace)::RawTRDescriptor,std::default_delete<(anonymous_namespace)::RawTRDescriptor>,void>
            (this_00,in_stack_ffffffffffffffa0);
  std::
  unique_ptr<(anonymous_namespace)::RawTRDescriptor,_std::default_delete<(anonymous_namespace)::RawTRDescriptor>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::RawTRDescriptor,_std::default_delete<(anonymous_namespace)::RawTRDescriptor>_>
                 *)this_00);
  std::
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                 *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
            )(tuple<(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
              )in_RDI.
               super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
               .super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<DescriptorImpl> Clone() const override
    {
        return std::make_unique<RawTRDescriptor>(m_pubkey_args.at(0)->Clone());
    }